

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
imrt::ApertureILS::getShuffledApertureNeighbors
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  _List_node_base *p_Var4;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  pair<int,_int> pVar10;
  _List_node_base *local_68;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_60;
  ulong local_50;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&stations,__x);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  for (uVar9 = 0;
      uVar9 < stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
              _M_node._M_size; uVar9 = uVar9 + 1) {
    lVar8 = 0;
    local_50 = uVar9;
    while( true ) {
      uVar9 = local_50;
      p_Var4 = local_68[1]._M_next;
      if (*(int *)&p_Var4[4]._M_next <= lVar8) break;
      pVar10 = (pair<int,_int>)(lVar8 << 0x20 | local_50);
      lVar7 = 0;
      while( true ) {
        iVar2 = Collimator::getXdim((Collimator *)p_Var4[0xb]._M_next);
        if (iVar2 <= lVar7) break;
        iVar2 = (int)lVar8;
        pVar5 = Station::getApertureShape((Station *)local_68[1]._M_next,iVar2,(int)lVar7);
        pVar6 = Collimator::getActiveRange
                          ((Collimator *)local_68[1]._M_next[0xb]._M_next,(int)lVar7,
                           *(int *)&(local_68[1]._M_next)->_M_prev);
        if (pVar6.first != -1) {
          uVar3 = Station::getBeamIndex
                            ((Station *)local_68[1]._M_next,
                             (pair<int,_int>)(((long)pVar5 << 0x20) + lVar7));
          bVar1 = Station::isOpenBeamlet((Station *)local_68[1]._M_next,uVar3,iVar2);
          local_60.first = pVar10;
          if (bVar1) {
            local_60.second = (pair<int,_int>)(((ulong)uVar3 << 0x20) + 0xffffffff);
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                        *)__return_storage_ptr__,&local_60);
          }
          else {
            local_60.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 1);
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                        *)__return_storage_ptr__,&local_60);
          }
          uVar3 = Station::getBeamIndex
                            ((Station *)local_68[1]._M_next,
                             (pair<int,_int>)(((ulong)pVar5 & 0xffffffff00000000) + lVar7));
          bVar1 = Station::isOpenBeamlet((Station *)local_68[1]._M_next,uVar3,iVar2);
          if (bVar1) {
            local_60.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 0xfffffffe);
            local_60.first = pVar10;
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                        *)__return_storage_ptr__,&local_60);
          }
          else {
            local_60.second = (pair<int,_int>)((ulong)uVar3 << 0x20 | 1);
            local_60.first = pVar10;
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::emplace_back<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                        *)__return_storage_ptr__,&local_60);
          }
        }
        lVar7 = lVar7 + 1;
        p_Var4 = local_68[1]._M_next;
      }
      lVar8 = lVar8 + 1;
    }
    std::__advance<std::_List_iterator<imrt::Station*>,long>(&local_68,1);
  }
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            ((__return_storage_ptr__->
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>::_M_clear
            (&stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>);
  return __return_storage_ptr__;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getShuffledApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair< pair<int,int> , pair<int, int> >> a_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();

  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
           a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));

        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
        if((*st)->isOpenBeamlet(beamlet, a))
           a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
        else 
           a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}